

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLOpts.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_150::GlobalAssignmentCollector::visitGlobal
          (GlobalAssignmentCollector *this,Global *curr)

{
  Id IVar1;
  bool bVar2;
  
  IVar1 = curr->init->_id;
  if (IVar1 == ConstId) {
    bVar2 = Literal::isZero((Literal *)(curr->init + 1));
  }
  else {
    bVar2 = IVar1 == RefNullId;
  }
  if (bVar2 != false) {
    return;
  }
  recordGlobalAssignment(this,(Name)(curr->super_Importable).super_Named.name.super_IString.str);
  return;
}

Assistant:

void visitGlobal(Global* curr) {
    if (isInitialValue(curr->init)) {
      return;
    }
    // J2CL normally doesn't set non-default initial values, however, just in
    // case other passes in binaryen do something and set a value to the global
    // we should back off by recording this as an assignment.
    recordGlobalAssignment(curr->name);
  }